

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_addHamming(DdManager *dd,DdNode **xVars,DdNode **yVars,int nVars)

{
  ulong uVar1;
  DdNode *pDVar2;
  DdNode *f;
  int local_54;
  int i;
  DdNode *temp;
  DdNode *tempAdd;
  DdNode *tempBdd;
  DdNode *result;
  int nVars_local;
  DdNode **yVars_local;
  DdNode **xVars_local;
  DdManager *dd_local;
  
  tempBdd = dd->zero;
  uVar1 = (ulong)tempBdd & 0xfffffffffffffffe;
  *(int *)(uVar1 + 4) = *(int *)(uVar1 + 4) + 1;
  local_54 = 0;
  while( true ) {
    if (nVars <= local_54) {
      *(int *)(((ulong)tempBdd & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)tempBdd & 0xfffffffffffffffe) + 4) + -1;
      return tempBdd;
    }
    pDVar2 = Cudd_bddIte(dd,xVars[local_54],(DdNode *)((ulong)yVars[local_54] ^ 1),yVars[local_54]);
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,tempBdd);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    f = Cudd_BddToAdd(dd,pDVar2);
    if (f == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar2);
      Cudd_RecursiveDeref(dd,tempBdd);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,pDVar2);
    pDVar2 = Cudd_addApply(dd,Cudd_addPlus,f,tempBdd);
    if (pDVar2 == (DdNode *)0x0) break;
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,f);
    Cudd_RecursiveDeref(dd,tempBdd);
    local_54 = local_54 + 1;
    tempBdd = pDVar2;
  }
  Cudd_RecursiveDeref(dd,f);
  Cudd_RecursiveDeref(dd,tempBdd);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addHamming(
  DdManager * dd,
  DdNode ** xVars,
  DdNode ** yVars,
  int  nVars)
{
    DdNode  *result,*tempBdd;
    DdNode  *tempAdd,*temp;
    int     i;

    result = DD_ZERO(dd);
    cuddRef(result);

    for (i = 0; i < nVars; i++) {
        tempBdd = Cudd_bddIte(dd,xVars[i],Cudd_Not(yVars[i]),yVars[i]);
        if (tempBdd == NULL) {
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(tempBdd);
        tempAdd = Cudd_BddToAdd(dd,tempBdd);
        if (tempAdd == NULL) {
            Cudd_RecursiveDeref(dd,tempBdd);
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(tempAdd);
        Cudd_RecursiveDeref(dd,tempBdd);
        temp = Cudd_addApply(dd,Cudd_addPlus,tempAdd,result);
        if (temp == NULL) {
            Cudd_RecursiveDeref(dd,tempAdd);
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(temp);
        Cudd_RecursiveDeref(dd,tempAdd);
        Cudd_RecursiveDeref(dd,result);
        result = temp;
    }

    cuddDeref(result);
    return(result);

}